

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorLink.c
# Opt level: O0

void ExorLinkCubeIteratorCleanUp(int fTakeLastGroup)

{
  int local_10;
  int c;
  int fTakeLastGroup_local;
  
  if (fWorking == 0) {
    __assert_fail("fWorking",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exorLink.c"
                  ,0x2cc,"void ExorLinkCubeIteratorCleanUp(int)");
  }
  if (fTakeLastGroup == 0) {
    for (local_10 = 0; local_10 < nCubesInGroup; local_10 = local_10 + 1) {
      ELCubes[local_10]->fMark = '\0';
      AddToFreeCubes(ELCubes[local_10]);
      ELCubes[local_10] = (Cube *)0x0;
    }
  }
  else {
    for (local_10 = 0; local_10 < nCubesInGroup; local_10 = local_10 + 1) {
      if (ELCubes[local_10] != (Cube *)0x0) {
        ELCubes[local_10]->fMark = '\0';
        if ((LastGroup & s_BitMasks[local_10]) == 0) {
          AddToFreeCubes(ELCubes[local_10]);
        }
        ELCubes[local_10] = (Cube *)0x0;
      }
    }
  }
  VisitedGroups = 0;
  fWorking = 0;
  return;
}

Assistant:

void ExorLinkCubeIteratorCleanUp( int fTakeLastGroup )
// removes the cubes from the store back into the list of free cubes
// if fTakeLastGroup is 0, removes all cubes
// if fTakeLastGroup is 1, does not store the last group
{
    int c;
    assert( fWorking );

    // put cubes back
    // set the cube pointers to zero
    if ( fTakeLastGroup == 0 )
        for ( c = 0; c < nCubesInGroup; c++ )
        {
            ELCubes[c]->fMark = 0;
            AddToFreeCubes( ELCubes[c] );
            ELCubes[c] = NULL;
        }
    else
        for ( c = 0; c < nCubesInGroup; c++ )
        if ( ELCubes[c] )
        {
            ELCubes[c]->fMark = 0;
            if ( (LastGroup & s_BitMasks[c]) == 0 ) // does not belong to the last group
                AddToFreeCubes( ELCubes[c] );
            ELCubes[c] = NULL;
        }

    // set the cube groups to zero
    VisitedGroups = 0;
    // shut down the iterator
    fWorking = 0;
}